

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>::ModeRm
          (ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *this,
          idx_t frame)

{
  __buckets_ptr pp_Var1;
  uhugeint_t *this_00;
  mapped_type *pmVar2;
  ulong uVar3;
  unordered_map<duckdb::uhugeint_t,_duckdb::ModeAttr,_std::hash<duckdb::uhugeint_t>,_std::equal_to<duckdb::uhugeint_t>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>_>
  *in_RDI;
  size_t old_count;
  mapped_type *attr;
  uhugeint_t *key;
  key_type *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd8;
  ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = GetCell(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar2 = std::
           unordered_map<duckdb::uhugeint_t,_duckdb::ModeAttr,_std::hash<duckdb::uhugeint_t>,_std::equal_to<duckdb::uhugeint_t>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>_>
           ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  pp_Var1 = (__buckets_ptr)pmVar2->count;
  (in_RDI->_M_h)._M_rehash_policy._M_next_resize =
       (in_RDI->_M_h)._M_rehash_policy._M_next_resize - (ulong)(pp_Var1 == (__buckets_ptr)0x1);
  pmVar2->count = pmVar2->count - 1;
  if ((in_RDI[1]._M_h._M_buckets == pp_Var1) &&
     (uVar3 = duckdb::uhugeint_t::operator==
                        (this_00,*(uhugeint_t **)&(in_RDI->_M_h)._M_rehash_policy), (uVar3 & 1) != 0
     )) {
    *(undefined1 *)&(in_RDI->_M_h)._M_single_bucket = 0;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}